

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TGAImage.h
# Opt level: O2

void __thiscall TRM::TGAColor::TGAColor(TGAColor *this,uchar *p,uchar bpp)

{
  uchar uVar1;
  int i;
  ulong uVar2;
  ulong uVar3;
  undefined3 in_register_00000011;
  
  this->bgra[0] = '\0';
  this->bgra[1] = '\0';
  this->bgra[2] = '\0';
  this->bgra[3] = '\0';
  this->bytespp = bpp;
  uVar2 = (ulong)CONCAT31(in_register_00000011,bpp);
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    this->bgra[uVar3] = p[uVar3];
  }
  for (; uVar2 < 4; uVar2 = uVar2 + 1) {
    this->bgra[uVar2] = '\0';
  }
  uVar1 = this->bgra[0];
  this->bgra[0] = this->bgra[2];
  this->bgra[2] = uVar1;
  return;
}

Assistant:

TGAColor(const unsigned char *p, unsigned char bpp) : bgra(), bytespp(bpp) {
    for (int i = 0; i < (int)bpp; i++) {
      bgra[i] = p[i];
    }
    for (int i = bpp; i < 4; i++) {
      bgra[i] = 0;
    }
    std::swap(bgra[0], bgra[2]);
  }